

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

char * whisper_bench_memcpy_str(int n_threads)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ulong uVar52;
  void *pvVar53;
  void *pvVar54;
  long lVar55;
  long lVar56;
  size_t sVar57;
  undefined8 uVar58;
  char cVar59;
  ulong uVar60;
  int iVar80;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar81;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  double dVar82;
  long lVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  int iVar122;
  undefined1 auVar118 [16];
  int iVar123;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  int iVar150;
  int iVar157;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  size_t size;
  size_t n;
  char *src;
  char *dst;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  char strbuf [256];
  uint local_1bc;
  ulong local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [16];
  void *local_190;
  void *local_188;
  long *local_180;
  undefined1 local_178 [16];
  int local_15c;
  thread local_158;
  vector<std::thread,_std::allocator<std::thread>_> local_150;
  char local_138 [264];
  
  if (whisper_bench_memcpy_str::s_abi_cxx11_ == '\0') {
    whisper_bench_memcpy_str_cold_1();
  }
  std::__cxx11::string::_M_replace
            (0x171150,0,(char *)whisper_bench_memcpy_str::s_abi_cxx11_._M_string_length,0x15be58);
  ggml_time_init();
  iVar80 = 0x400;
  if (n_threads < 1) {
    iVar80 = n_threads;
  }
  auVar61._8_4_ = iVar80 >> 0x1f;
  auVar61._0_8_ = (long)iVar80;
  auVar61._12_4_ = 0x45300000;
  dVar82 = ((auVar61._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,iVar80) - 4503599627370496.0)) * 1000000.0;
  local_1b0 = 0x14;
  uVar52 = (ulong)dVar82;
  uVar52 = (long)(dVar82 - 9.223372036854776e+18) & (long)uVar52 >> 0x3f | uVar52;
  local_1b8 = uVar52;
  pvVar53 = malloc(uVar52);
  pvVar54 = malloc(uVar52);
  auVar61 = _DAT_0015a0a0;
  if (uVar52 != 0) {
    lVar55 = uVar52 - 1;
    local_1a8._8_4_ = (int)lVar55;
    local_1a8._0_8_ = lVar55;
    local_1a8._12_4_ = (int)((ulong)lVar55 >> 0x20);
    uVar60 = 0;
    auVar62 = local_1a8;
    auVar120 = _DAT_0015a170;
    auVar137 = _DAT_0015a180;
    auVar89 = _DAT_0015a190;
    auVar91 = _DAT_0015a1a0;
    auVar93 = _DAT_0015a1b0;
    auVar95 = _DAT_0015a1c0;
    auVar97 = _DAT_0015a080;
    auVar99 = _DAT_0015a090;
    do {
      auVar118 = local_1a8 ^ auVar61;
      auVar124 = auVar99 ^ auVar61;
      iVar80 = auVar118._0_4_;
      iVar150 = -(uint)(iVar80 < auVar124._0_4_);
      iVar81 = auVar118._4_4_;
      auVar126._4_4_ = -(uint)(iVar81 < auVar124._4_4_);
      iVar122 = auVar118._8_4_;
      iVar157 = -(uint)(iVar122 < auVar124._8_4_);
      iVar123 = auVar118._12_4_;
      auVar126._12_4_ = -(uint)(iVar123 < auVar124._12_4_);
      auVar118._4_4_ = iVar150;
      auVar118._0_4_ = iVar150;
      auVar118._8_4_ = iVar157;
      auVar118._12_4_ = iVar157;
      auVar118 = pshuflw(auVar62,auVar118,0xe8);
      auVar125._4_4_ = -(uint)(auVar124._4_4_ == iVar81);
      auVar125._12_4_ = -(uint)(auVar124._12_4_ == iVar123);
      auVar125._0_4_ = auVar125._4_4_;
      auVar125._8_4_ = auVar125._12_4_;
      auVar101 = pshuflw(in_XMM11,auVar125,0xe8);
      auVar126._0_4_ = auVar126._4_4_;
      auVar126._8_4_ = auVar126._12_4_;
      auVar124 = pshuflw(auVar118,auVar126,0xe8);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar62 = (auVar124 | auVar101 & auVar118) ^ auVar62;
      auVar62 = packssdw(auVar62,auVar62);
      cVar59 = (char)uVar60;
      if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60) = cVar59;
      }
      auVar101._4_4_ = iVar150;
      auVar101._0_4_ = iVar150;
      auVar101._8_4_ = iVar157;
      auVar101._12_4_ = iVar157;
      auVar126 = auVar125 & auVar101 | auVar126;
      auVar62 = packssdw(auVar126,auVar126);
      auVar124._8_4_ = 0xffffffff;
      auVar124._0_8_ = 0xffffffffffffffff;
      auVar124._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 ^ auVar124,auVar62 ^ auVar124);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._0_4_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 1) = cVar59 + '\x01';
      }
      auVar62 = auVar97 ^ auVar61;
      auVar102._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar102._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar102._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar102._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar127._4_4_ = auVar102._0_4_;
      auVar127._0_4_ = auVar102._0_4_;
      auVar127._8_4_ = auVar102._8_4_;
      auVar127._12_4_ = auVar102._8_4_;
      iVar150 = -(uint)(auVar62._4_4_ == iVar81);
      iVar157 = -(uint)(auVar62._12_4_ == iVar123);
      auVar22._4_4_ = iVar150;
      auVar22._0_4_ = iVar150;
      auVar22._8_4_ = iVar157;
      auVar22._12_4_ = iVar157;
      auVar151._4_4_ = auVar102._4_4_;
      auVar151._0_4_ = auVar102._4_4_;
      auVar151._8_4_ = auVar102._12_4_;
      auVar151._12_4_ = auVar102._12_4_;
      auVar62 = auVar22 & auVar127 | auVar151;
      auVar62 = packssdw(auVar62,auVar62);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 ^ auVar3,auVar62 ^ auVar3);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 2) = cVar59 + '\x02';
      }
      auVar62 = pshufhw(auVar62,auVar127,0x84);
      auVar23._4_4_ = iVar150;
      auVar23._0_4_ = iVar150;
      auVar23._8_4_ = iVar157;
      auVar23._12_4_ = iVar157;
      auVar124 = pshufhw(auVar102,auVar23,0x84);
      auVar118 = pshufhw(auVar62,auVar151,0x84);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar63 = (auVar118 | auVar124 & auVar62) ^ auVar63;
      auVar62 = packssdw(auVar63,auVar63);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._0_4_ >> 0x18 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 3) = cVar59 + '\x03';
      }
      auVar62 = auVar95 ^ auVar61;
      auVar103._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar103._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar103._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar103._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar24._4_4_ = auVar103._0_4_;
      auVar24._0_4_ = auVar103._0_4_;
      auVar24._8_4_ = auVar103._8_4_;
      auVar24._12_4_ = auVar103._8_4_;
      auVar124 = pshuflw(auVar151,auVar24,0xe8);
      auVar64._0_4_ = -(uint)(auVar62._0_4_ == iVar80);
      auVar64._4_4_ = -(uint)(auVar62._4_4_ == iVar81);
      auVar64._8_4_ = -(uint)(auVar62._8_4_ == iVar122);
      auVar64._12_4_ = -(uint)(auVar62._12_4_ == iVar123);
      auVar128._4_4_ = auVar64._4_4_;
      auVar128._0_4_ = auVar64._4_4_;
      auVar128._8_4_ = auVar64._12_4_;
      auVar128._12_4_ = auVar64._12_4_;
      auVar62 = pshuflw(auVar64,auVar128,0xe8);
      auVar129._4_4_ = auVar103._4_4_;
      auVar129._0_4_ = auVar103._4_4_;
      auVar129._8_4_ = auVar103._12_4_;
      auVar129._12_4_ = auVar103._12_4_;
      auVar118 = pshuflw(auVar103,auVar129,0xe8);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 & auVar124,(auVar118 | auVar62 & auVar124) ^ auVar4);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 4) = cVar59 + '\x04';
      }
      auVar25._4_4_ = auVar103._0_4_;
      auVar25._0_4_ = auVar103._0_4_;
      auVar25._8_4_ = auVar103._8_4_;
      auVar25._12_4_ = auVar103._8_4_;
      auVar129 = auVar128 & auVar25 | auVar129;
      auVar118 = packssdw(auVar129,auVar129);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62,auVar118 ^ auVar5);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._4_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 5) = cVar59 + '\x05';
      }
      auVar62 = auVar93 ^ auVar61;
      auVar104._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar104._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar104._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar104._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar130._4_4_ = auVar104._0_4_;
      auVar130._0_4_ = auVar104._0_4_;
      auVar130._8_4_ = auVar104._8_4_;
      auVar130._12_4_ = auVar104._8_4_;
      iVar150 = -(uint)(auVar62._4_4_ == iVar81);
      iVar157 = -(uint)(auVar62._12_4_ == iVar123);
      auVar26._4_4_ = iVar150;
      auVar26._0_4_ = iVar150;
      auVar26._8_4_ = iVar157;
      auVar26._12_4_ = iVar157;
      auVar152._4_4_ = auVar104._4_4_;
      auVar152._0_4_ = auVar104._4_4_;
      auVar152._8_4_ = auVar104._12_4_;
      auVar152._12_4_ = auVar104._12_4_;
      auVar62 = auVar26 & auVar130 | auVar152;
      auVar62 = packssdw(auVar62,auVar62);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 ^ auVar6,auVar62 ^ auVar6);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 6) = cVar59 + '\x06';
      }
      auVar62 = pshufhw(auVar62,auVar130,0x84);
      auVar27._4_4_ = iVar150;
      auVar27._0_4_ = iVar150;
      auVar27._8_4_ = iVar157;
      auVar27._12_4_ = iVar157;
      auVar124 = pshufhw(auVar104,auVar27,0x84);
      auVar118 = pshufhw(auVar62,auVar152,0x84);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar65 = (auVar118 | auVar124 & auVar62) ^ auVar65;
      auVar62 = packssdw(auVar65,auVar65);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._6_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 7) = cVar59 + '\a';
      }
      auVar62 = auVar91 ^ auVar61;
      auVar105._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar105._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar105._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar105._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar28._4_4_ = auVar105._0_4_;
      auVar28._0_4_ = auVar105._0_4_;
      auVar28._8_4_ = auVar105._8_4_;
      auVar28._12_4_ = auVar105._8_4_;
      auVar124 = pshuflw(auVar152,auVar28,0xe8);
      auVar66._0_4_ = -(uint)(auVar62._0_4_ == iVar80);
      auVar66._4_4_ = -(uint)(auVar62._4_4_ == iVar81);
      auVar66._8_4_ = -(uint)(auVar62._8_4_ == iVar122);
      auVar66._12_4_ = -(uint)(auVar62._12_4_ == iVar123);
      auVar131._4_4_ = auVar66._4_4_;
      auVar131._0_4_ = auVar66._4_4_;
      auVar131._8_4_ = auVar66._12_4_;
      auVar131._12_4_ = auVar66._12_4_;
      auVar62 = pshuflw(auVar66,auVar131,0xe8);
      auVar132._4_4_ = auVar105._4_4_;
      auVar132._0_4_ = auVar105._4_4_;
      auVar132._8_4_ = auVar105._12_4_;
      auVar132._12_4_ = auVar105._12_4_;
      auVar118 = pshuflw(auVar105,auVar132,0xe8);
      auVar106._8_4_ = 0xffffffff;
      auVar106._0_8_ = 0xffffffffffffffff;
      auVar106._12_4_ = 0xffffffff;
      auVar106 = (auVar118 | auVar62 & auVar124) ^ auVar106;
      auVar118 = packssdw(auVar106,auVar106);
      auVar62 = packsswb(auVar62 & auVar124,auVar118);
      if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 8) = cVar59 + '\b';
      }
      auVar29._4_4_ = auVar105._0_4_;
      auVar29._0_4_ = auVar105._0_4_;
      auVar29._8_4_ = auVar105._8_4_;
      auVar29._12_4_ = auVar105._8_4_;
      auVar132 = auVar131 & auVar29 | auVar132;
      auVar118 = packssdw(auVar132,auVar132);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar118 = packssdw(auVar118 ^ auVar7,auVar118 ^ auVar7);
      auVar62 = packsswb(auVar62,auVar118);
      if ((auVar62._8_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 9) = cVar59 + '\t';
      }
      auVar62 = auVar89 ^ auVar61;
      auVar107._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar107._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar107._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar107._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar133._4_4_ = auVar107._0_4_;
      auVar133._0_4_ = auVar107._0_4_;
      auVar133._8_4_ = auVar107._8_4_;
      auVar133._12_4_ = auVar107._8_4_;
      iVar150 = -(uint)(auVar62._4_4_ == iVar81);
      iVar157 = -(uint)(auVar62._12_4_ == iVar123);
      auVar30._4_4_ = iVar150;
      auVar30._0_4_ = iVar150;
      auVar30._8_4_ = iVar157;
      auVar30._12_4_ = iVar157;
      auVar153._4_4_ = auVar107._4_4_;
      auVar153._0_4_ = auVar107._4_4_;
      auVar153._8_4_ = auVar107._12_4_;
      auVar153._12_4_ = auVar107._12_4_;
      auVar62 = auVar30 & auVar133 | auVar153;
      auVar62 = packssdw(auVar62,auVar62);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 ^ auVar8,auVar62 ^ auVar8);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 10) = cVar59 + '\n';
      }
      auVar62 = pshufhw(auVar62,auVar133,0x84);
      auVar31._4_4_ = iVar150;
      auVar31._0_4_ = iVar150;
      auVar31._8_4_ = iVar157;
      auVar31._12_4_ = iVar157;
      auVar124 = pshufhw(auVar107,auVar31,0x84);
      auVar118 = pshufhw(auVar62,auVar153,0x84);
      auVar67._8_4_ = 0xffffffff;
      auVar67._0_8_ = 0xffffffffffffffff;
      auVar67._12_4_ = 0xffffffff;
      auVar67 = (auVar118 | auVar124 & auVar62) ^ auVar67;
      auVar62 = packssdw(auVar67,auVar67);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._10_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 0xb) = cVar59 + '\v';
      }
      auVar62 = auVar137 ^ auVar61;
      auVar108._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar108._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar108._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar108._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar32._4_4_ = auVar108._0_4_;
      auVar32._0_4_ = auVar108._0_4_;
      auVar32._8_4_ = auVar108._8_4_;
      auVar32._12_4_ = auVar108._8_4_;
      auVar124 = pshuflw(auVar153,auVar32,0xe8);
      auVar68._0_4_ = -(uint)(auVar62._0_4_ == iVar80);
      auVar68._4_4_ = -(uint)(auVar62._4_4_ == iVar81);
      auVar68._8_4_ = -(uint)(auVar62._8_4_ == iVar122);
      auVar68._12_4_ = -(uint)(auVar62._12_4_ == iVar123);
      auVar134._4_4_ = auVar68._4_4_;
      auVar134._0_4_ = auVar68._4_4_;
      auVar134._8_4_ = auVar68._12_4_;
      auVar134._12_4_ = auVar68._12_4_;
      auVar62 = pshuflw(auVar68,auVar134,0xe8);
      auVar135._4_4_ = auVar108._4_4_;
      auVar135._0_4_ = auVar108._4_4_;
      auVar135._8_4_ = auVar108._12_4_;
      auVar135._12_4_ = auVar108._12_4_;
      auVar118 = pshuflw(auVar108,auVar135,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 & auVar124,(auVar118 | auVar62 & auVar124) ^ auVar9);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 0xc) = cVar59 + '\f';
      }
      auVar33._4_4_ = auVar108._0_4_;
      auVar33._0_4_ = auVar108._0_4_;
      auVar33._8_4_ = auVar108._8_4_;
      auVar33._12_4_ = auVar108._8_4_;
      auVar135 = auVar134 & auVar33 | auVar135;
      auVar118 = packssdw(auVar135,auVar135);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62,auVar118 ^ auVar10);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._12_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 0xd) = cVar59 + '\r';
      }
      auVar62 = auVar120 ^ auVar61;
      auVar109._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar109._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar109._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar109._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar136._4_4_ = auVar109._0_4_;
      auVar136._0_4_ = auVar109._0_4_;
      auVar136._8_4_ = auVar109._8_4_;
      auVar136._12_4_ = auVar109._8_4_;
      iVar80 = -(uint)(auVar62._4_4_ == iVar81);
      iVar81 = -(uint)(auVar62._12_4_ == iVar123);
      auVar119._4_4_ = iVar80;
      auVar119._0_4_ = iVar80;
      auVar119._8_4_ = iVar81;
      auVar119._12_4_ = iVar81;
      auVar69._4_4_ = auVar109._4_4_;
      auVar69._0_4_ = auVar109._4_4_;
      auVar69._8_4_ = auVar109._12_4_;
      auVar69._12_4_ = auVar109._12_4_;
      auVar69 = auVar119 & auVar136 | auVar69;
      auVar62 = packssdw(auVar69,auVar69);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 ^ auVar11,auVar62 ^ auVar11);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 0xe) = cVar59 + '\x0e';
      }
      auVar62 = pshufhw(auVar62,auVar136,0x84);
      in_XMM11 = pshufhw(auVar109,auVar119,0x84);
      in_XMM11 = in_XMM11 & auVar62;
      auVar34._4_4_ = auVar109._4_4_;
      auVar34._0_4_ = auVar109._4_4_;
      auVar34._8_4_ = auVar109._12_4_;
      auVar34._12_4_ = auVar109._12_4_;
      auVar62 = pshufhw(auVar62,auVar34,0x84);
      auVar70._8_4_ = 0xffffffff;
      auVar70._0_8_ = 0xffffffffffffffff;
      auVar70._12_4_ = 0xffffffff;
      auVar70 = (auVar62 | in_XMM11) ^ auVar70;
      auVar62 = packssdw(auVar70,auVar70);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._14_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 0xf) = cVar59 + '\x0f';
      }
      uVar60 = uVar60 + 0x10;
      lVar55 = (long)DAT_0015a1d0;
      lVar86 = auVar99._8_8_;
      auVar99._0_8_ = auVar99._0_8_ + lVar55;
      lVar56 = DAT_0015a1d0._8_8_;
      auVar99._8_8_ = lVar86 + lVar56;
      lVar86 = auVar97._8_8_;
      auVar97._0_8_ = auVar97._0_8_ + lVar55;
      auVar97._8_8_ = lVar86 + lVar56;
      lVar86 = auVar95._8_8_;
      auVar95._0_8_ = auVar95._0_8_ + lVar55;
      auVar95._8_8_ = lVar86 + lVar56;
      lVar86 = auVar93._8_8_;
      auVar93._0_8_ = auVar93._0_8_ + lVar55;
      auVar93._8_8_ = lVar86 + lVar56;
      lVar86 = auVar91._8_8_;
      auVar91._0_8_ = auVar91._0_8_ + lVar55;
      auVar91._8_8_ = lVar86 + lVar56;
      lVar86 = auVar89._8_8_;
      auVar89._0_8_ = auVar89._0_8_ + lVar55;
      auVar89._8_8_ = lVar86 + lVar56;
      lVar86 = auVar137._8_8_;
      auVar137._0_8_ = auVar137._0_8_ + lVar55;
      auVar137._8_8_ = lVar86 + lVar56;
      lVar86 = auVar120._8_8_;
      auVar120._0_8_ = auVar120._0_8_ + lVar55;
      auVar120._8_8_ = lVar86 + lVar56;
      auVar62 = _DAT_0015a1d0;
    } while ((uVar52 + 0xf & 0xfffffffffffffff0) != uVar60);
  }
  memcpy(pvVar54,pvVar53,uVar52);
  dVar82 = 0.0;
  if (local_1b0 != 0) {
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_1a8._8_8_;
    local_1a8 = auVar50 << 0x40;
    uVar52 = 0;
    do {
      lVar55 = ggml_time_us();
      memcpy(pvVar54,pvVar53,local_1b8);
      lVar56 = ggml_time_us();
      local_1a8._0_8_ = (double)local_1a8._0_8_ + (double)(lVar56 - lVar55) * 1e-06;
      iVar80 = rand();
      iVar81 = rand();
      *(char *)((long)pvVar53 + (ulong)(long)iVar81 % local_1b8) = (char)iVar80;
      uVar52 = uVar52 + 1;
    } while (uVar52 < local_1b0);
    dVar82 = (double)local_1a8._0_8_ * 1000000000.0;
  }
  lVar55 = local_1b0 * local_1b8;
  auVar83._8_4_ = (int)((ulong)lVar55 >> 0x20);
  auVar83._0_8_ = lVar55;
  auVar83._12_4_ = 0x45300000;
  snprintf(local_138,0x100,"memcpy: %7.2f GB/s (heat-up)\n",
           ((auVar83._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar55) - 4503599627370496.0)) / dVar82);
  std::__cxx11::string::append((char *)&whisper_bench_memcpy_str::s_abi_cxx11_);
  uVar52 = local_1b8;
  dVar82 = 0.0;
  if (local_1b8 != 0) {
    sVar57 = 0;
    do {
      dVar82 = dVar82 + (double)(int)*(char *)((long)pvVar54 + sVar57);
      sVar57 = sVar57 + 1;
    } while (local_1b8 != sVar57);
  }
  local_1a8._0_8_ = dVar82;
  free(pvVar53);
  free(pvVar54);
  pvVar53 = malloc(uVar52);
  pvVar54 = malloc(uVar52);
  auVar61 = _DAT_0015a0a0;
  if (uVar52 != 0) {
    lVar55 = uVar52 - 1;
    local_178._8_4_ = (int)lVar55;
    local_178._0_8_ = lVar55;
    local_178._12_4_ = (int)((ulong)lVar55 >> 0x20);
    uVar60 = 0;
    auVar62 = local_178;
    auVar84 = _DAT_0015a170;
    auVar87 = _DAT_0015a180;
    auVar90 = _DAT_0015a190;
    auVar92 = _DAT_0015a1a0;
    auVar94 = _DAT_0015a1b0;
    auVar96 = _DAT_0015a1c0;
    auVar98 = _DAT_0015a080;
    auVar100 = _DAT_0015a090;
    do {
      auVar120 = local_178 ^ auVar61;
      auVar137 = auVar100 ^ auVar61;
      iVar80 = auVar120._0_4_;
      iVar150 = -(uint)(iVar80 < auVar137._0_4_);
      iVar81 = auVar120._4_4_;
      auVar139._4_4_ = -(uint)(iVar81 < auVar137._4_4_);
      iVar122 = auVar120._8_4_;
      iVar157 = -(uint)(iVar122 < auVar137._8_4_);
      iVar123 = auVar120._12_4_;
      auVar139._12_4_ = -(uint)(iVar123 < auVar137._12_4_);
      auVar35._4_4_ = iVar150;
      auVar35._0_4_ = iVar150;
      auVar35._8_4_ = iVar157;
      auVar35._12_4_ = iVar157;
      auVar62 = pshuflw(auVar62,auVar35,0xe8);
      auVar138._4_4_ = -(uint)(auVar137._4_4_ == iVar81);
      auVar138._12_4_ = -(uint)(auVar137._12_4_ == iVar123);
      auVar138._0_4_ = auVar138._4_4_;
      auVar138._8_4_ = auVar138._12_4_;
      auVar137 = pshuflw(in_XMM11,auVar138,0xe8);
      auVar139._0_4_ = auVar139._4_4_;
      auVar139._8_4_ = auVar139._12_4_;
      auVar120 = pshuflw(auVar62,auVar139,0xe8);
      auVar71._8_4_ = 0xffffffff;
      auVar71._0_8_ = 0xffffffffffffffff;
      auVar71._12_4_ = 0xffffffff;
      auVar71 = (auVar120 | auVar137 & auVar62) ^ auVar71;
      auVar62 = packssdw(auVar71,auVar71);
      cVar59 = (char)uVar60;
      if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60) = cVar59;
      }
      auVar36._4_4_ = iVar150;
      auVar36._0_4_ = iVar150;
      auVar36._8_4_ = iVar157;
      auVar36._12_4_ = iVar157;
      auVar139 = auVar138 & auVar36 | auVar139;
      auVar62 = packssdw(auVar139,auVar139);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 ^ auVar12,auVar62 ^ auVar12);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._0_4_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 1) = cVar59 + '\x01';
      }
      auVar62 = auVar98 ^ auVar61;
      auVar110._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar110._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar110._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar110._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar140._4_4_ = auVar110._0_4_;
      auVar140._0_4_ = auVar110._0_4_;
      auVar140._8_4_ = auVar110._8_4_;
      auVar140._12_4_ = auVar110._8_4_;
      iVar150 = -(uint)(auVar62._4_4_ == iVar81);
      iVar157 = -(uint)(auVar62._12_4_ == iVar123);
      auVar37._4_4_ = iVar150;
      auVar37._0_4_ = iVar150;
      auVar37._8_4_ = iVar157;
      auVar37._12_4_ = iVar157;
      auVar154._4_4_ = auVar110._4_4_;
      auVar154._0_4_ = auVar110._4_4_;
      auVar154._8_4_ = auVar110._12_4_;
      auVar154._12_4_ = auVar110._12_4_;
      auVar62 = auVar37 & auVar140 | auVar154;
      auVar62 = packssdw(auVar62,auVar62);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 ^ auVar13,auVar62 ^ auVar13);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 2) = cVar59 + '\x02';
      }
      auVar62 = pshufhw(auVar62,auVar140,0x84);
      auVar38._4_4_ = iVar150;
      auVar38._0_4_ = iVar150;
      auVar38._8_4_ = iVar157;
      auVar38._12_4_ = iVar157;
      auVar137 = pshufhw(auVar110,auVar38,0x84);
      auVar120 = pshufhw(auVar62,auVar154,0x84);
      auVar72._8_4_ = 0xffffffff;
      auVar72._0_8_ = 0xffffffffffffffff;
      auVar72._12_4_ = 0xffffffff;
      auVar72 = (auVar120 | auVar137 & auVar62) ^ auVar72;
      auVar62 = packssdw(auVar72,auVar72);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._0_4_ >> 0x18 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 3) = cVar59 + '\x03';
      }
      auVar62 = auVar96 ^ auVar61;
      auVar111._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar111._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar111._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar111._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar39._4_4_ = auVar111._0_4_;
      auVar39._0_4_ = auVar111._0_4_;
      auVar39._8_4_ = auVar111._8_4_;
      auVar39._12_4_ = auVar111._8_4_;
      auVar137 = pshuflw(auVar154,auVar39,0xe8);
      auVar73._0_4_ = -(uint)(auVar62._0_4_ == iVar80);
      auVar73._4_4_ = -(uint)(auVar62._4_4_ == iVar81);
      auVar73._8_4_ = -(uint)(auVar62._8_4_ == iVar122);
      auVar73._12_4_ = -(uint)(auVar62._12_4_ == iVar123);
      auVar141._4_4_ = auVar73._4_4_;
      auVar141._0_4_ = auVar73._4_4_;
      auVar141._8_4_ = auVar73._12_4_;
      auVar141._12_4_ = auVar73._12_4_;
      auVar62 = pshuflw(auVar73,auVar141,0xe8);
      auVar142._4_4_ = auVar111._4_4_;
      auVar142._0_4_ = auVar111._4_4_;
      auVar142._8_4_ = auVar111._12_4_;
      auVar142._12_4_ = auVar111._12_4_;
      auVar120 = pshuflw(auVar111,auVar142,0xe8);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 & auVar137,(auVar120 | auVar62 & auVar137) ^ auVar14);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 4) = cVar59 + '\x04';
      }
      auVar40._4_4_ = auVar111._0_4_;
      auVar40._0_4_ = auVar111._0_4_;
      auVar40._8_4_ = auVar111._8_4_;
      auVar40._12_4_ = auVar111._8_4_;
      auVar142 = auVar141 & auVar40 | auVar142;
      auVar120 = packssdw(auVar142,auVar142);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62,auVar120 ^ auVar15);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._4_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 5) = cVar59 + '\x05';
      }
      auVar62 = auVar94 ^ auVar61;
      auVar112._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar112._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar112._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar112._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar143._4_4_ = auVar112._0_4_;
      auVar143._0_4_ = auVar112._0_4_;
      auVar143._8_4_ = auVar112._8_4_;
      auVar143._12_4_ = auVar112._8_4_;
      iVar150 = -(uint)(auVar62._4_4_ == iVar81);
      iVar157 = -(uint)(auVar62._12_4_ == iVar123);
      auVar41._4_4_ = iVar150;
      auVar41._0_4_ = iVar150;
      auVar41._8_4_ = iVar157;
      auVar41._12_4_ = iVar157;
      auVar155._4_4_ = auVar112._4_4_;
      auVar155._0_4_ = auVar112._4_4_;
      auVar155._8_4_ = auVar112._12_4_;
      auVar155._12_4_ = auVar112._12_4_;
      auVar62 = auVar41 & auVar143 | auVar155;
      auVar62 = packssdw(auVar62,auVar62);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 ^ auVar16,auVar62 ^ auVar16);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 6) = cVar59 + '\x06';
      }
      auVar62 = pshufhw(auVar62,auVar143,0x84);
      auVar42._4_4_ = iVar150;
      auVar42._0_4_ = iVar150;
      auVar42._8_4_ = iVar157;
      auVar42._12_4_ = iVar157;
      auVar137 = pshufhw(auVar112,auVar42,0x84);
      auVar120 = pshufhw(auVar62,auVar155,0x84);
      auVar74._8_4_ = 0xffffffff;
      auVar74._0_8_ = 0xffffffffffffffff;
      auVar74._12_4_ = 0xffffffff;
      auVar74 = (auVar120 | auVar137 & auVar62) ^ auVar74;
      auVar62 = packssdw(auVar74,auVar74);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._6_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 7) = cVar59 + '\a';
      }
      auVar62 = auVar92 ^ auVar61;
      auVar113._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar113._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar113._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar113._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar43._4_4_ = auVar113._0_4_;
      auVar43._0_4_ = auVar113._0_4_;
      auVar43._8_4_ = auVar113._8_4_;
      auVar43._12_4_ = auVar113._8_4_;
      auVar137 = pshuflw(auVar155,auVar43,0xe8);
      auVar75._0_4_ = -(uint)(auVar62._0_4_ == iVar80);
      auVar75._4_4_ = -(uint)(auVar62._4_4_ == iVar81);
      auVar75._8_4_ = -(uint)(auVar62._8_4_ == iVar122);
      auVar75._12_4_ = -(uint)(auVar62._12_4_ == iVar123);
      auVar144._4_4_ = auVar75._4_4_;
      auVar144._0_4_ = auVar75._4_4_;
      auVar144._8_4_ = auVar75._12_4_;
      auVar144._12_4_ = auVar75._12_4_;
      auVar62 = pshuflw(auVar75,auVar144,0xe8);
      auVar145._4_4_ = auVar113._4_4_;
      auVar145._0_4_ = auVar113._4_4_;
      auVar145._8_4_ = auVar113._12_4_;
      auVar145._12_4_ = auVar113._12_4_;
      auVar120 = pshuflw(auVar113,auVar145,0xe8);
      auVar114._8_4_ = 0xffffffff;
      auVar114._0_8_ = 0xffffffffffffffff;
      auVar114._12_4_ = 0xffffffff;
      auVar114 = (auVar120 | auVar62 & auVar137) ^ auVar114;
      auVar120 = packssdw(auVar114,auVar114);
      auVar62 = packsswb(auVar62 & auVar137,auVar120);
      if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 8) = cVar59 + '\b';
      }
      auVar44._4_4_ = auVar113._0_4_;
      auVar44._0_4_ = auVar113._0_4_;
      auVar44._8_4_ = auVar113._8_4_;
      auVar44._12_4_ = auVar113._8_4_;
      auVar145 = auVar144 & auVar44 | auVar145;
      auVar120 = packssdw(auVar145,auVar145);
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      auVar120 = packssdw(auVar120 ^ auVar17,auVar120 ^ auVar17);
      auVar62 = packsswb(auVar62,auVar120);
      if ((auVar62._8_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 9) = cVar59 + '\t';
      }
      auVar62 = auVar90 ^ auVar61;
      auVar115._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar115._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar115._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar115._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar146._4_4_ = auVar115._0_4_;
      auVar146._0_4_ = auVar115._0_4_;
      auVar146._8_4_ = auVar115._8_4_;
      auVar146._12_4_ = auVar115._8_4_;
      iVar150 = -(uint)(auVar62._4_4_ == iVar81);
      iVar157 = -(uint)(auVar62._12_4_ == iVar123);
      auVar45._4_4_ = iVar150;
      auVar45._0_4_ = iVar150;
      auVar45._8_4_ = iVar157;
      auVar45._12_4_ = iVar157;
      auVar156._4_4_ = auVar115._4_4_;
      auVar156._0_4_ = auVar115._4_4_;
      auVar156._8_4_ = auVar115._12_4_;
      auVar156._12_4_ = auVar115._12_4_;
      auVar62 = auVar45 & auVar146 | auVar156;
      auVar62 = packssdw(auVar62,auVar62);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 ^ auVar18,auVar62 ^ auVar18);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 10) = cVar59 + '\n';
      }
      auVar62 = pshufhw(auVar62,auVar146,0x84);
      auVar46._4_4_ = iVar150;
      auVar46._0_4_ = iVar150;
      auVar46._8_4_ = iVar157;
      auVar46._12_4_ = iVar157;
      auVar137 = pshufhw(auVar115,auVar46,0x84);
      auVar120 = pshufhw(auVar62,auVar156,0x84);
      auVar76._8_4_ = 0xffffffff;
      auVar76._0_8_ = 0xffffffffffffffff;
      auVar76._12_4_ = 0xffffffff;
      auVar76 = (auVar120 | auVar137 & auVar62) ^ auVar76;
      auVar62 = packssdw(auVar76,auVar76);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._10_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 0xb) = cVar59 + '\v';
      }
      auVar62 = auVar87 ^ auVar61;
      auVar116._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar116._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar116._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar116._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar47._4_4_ = auVar116._0_4_;
      auVar47._0_4_ = auVar116._0_4_;
      auVar47._8_4_ = auVar116._8_4_;
      auVar47._12_4_ = auVar116._8_4_;
      auVar137 = pshuflw(auVar156,auVar47,0xe8);
      auVar77._0_4_ = -(uint)(auVar62._0_4_ == iVar80);
      auVar77._4_4_ = -(uint)(auVar62._4_4_ == iVar81);
      auVar77._8_4_ = -(uint)(auVar62._8_4_ == iVar122);
      auVar77._12_4_ = -(uint)(auVar62._12_4_ == iVar123);
      auVar147._4_4_ = auVar77._4_4_;
      auVar147._0_4_ = auVar77._4_4_;
      auVar147._8_4_ = auVar77._12_4_;
      auVar147._12_4_ = auVar77._12_4_;
      auVar62 = pshuflw(auVar77,auVar147,0xe8);
      auVar148._4_4_ = auVar116._4_4_;
      auVar148._0_4_ = auVar116._4_4_;
      auVar148._8_4_ = auVar116._12_4_;
      auVar148._12_4_ = auVar116._12_4_;
      auVar120 = pshuflw(auVar116,auVar148,0xe8);
      auVar19._8_4_ = 0xffffffff;
      auVar19._0_8_ = 0xffffffffffffffff;
      auVar19._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 & auVar137,(auVar120 | auVar62 & auVar137) ^ auVar19);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 0xc) = cVar59 + '\f';
      }
      auVar48._4_4_ = auVar116._0_4_;
      auVar48._0_4_ = auVar116._0_4_;
      auVar48._8_4_ = auVar116._8_4_;
      auVar48._12_4_ = auVar116._8_4_;
      auVar148 = auVar147 & auVar48 | auVar148;
      auVar120 = packssdw(auVar148,auVar148);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62,auVar120 ^ auVar20);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._12_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 0xd) = cVar59 + '\r';
      }
      auVar62 = auVar84 ^ auVar61;
      auVar117._0_4_ = -(uint)(iVar80 < auVar62._0_4_);
      auVar117._4_4_ = -(uint)(iVar81 < auVar62._4_4_);
      auVar117._8_4_ = -(uint)(iVar122 < auVar62._8_4_);
      auVar117._12_4_ = -(uint)(iVar123 < auVar62._12_4_);
      auVar149._4_4_ = auVar117._0_4_;
      auVar149._0_4_ = auVar117._0_4_;
      auVar149._8_4_ = auVar117._8_4_;
      auVar149._12_4_ = auVar117._8_4_;
      iVar80 = -(uint)(auVar62._4_4_ == iVar81);
      iVar81 = -(uint)(auVar62._12_4_ == iVar123);
      auVar121._4_4_ = iVar80;
      auVar121._0_4_ = iVar80;
      auVar121._8_4_ = iVar81;
      auVar121._12_4_ = iVar81;
      auVar78._4_4_ = auVar117._4_4_;
      auVar78._0_4_ = auVar117._4_4_;
      auVar78._8_4_ = auVar117._12_4_;
      auVar78._12_4_ = auVar117._12_4_;
      auVar78 = auVar121 & auVar149 | auVar78;
      auVar62 = packssdw(auVar78,auVar78);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 ^ auVar21,auVar62 ^ auVar21);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar53 + uVar60 + 0xe) = cVar59 + '\x0e';
      }
      auVar62 = pshufhw(auVar62,auVar149,0x84);
      in_XMM11 = pshufhw(auVar117,auVar121,0x84);
      in_XMM11 = in_XMM11 & auVar62;
      auVar49._4_4_ = auVar117._4_4_;
      auVar49._0_4_ = auVar117._4_4_;
      auVar49._8_4_ = auVar117._12_4_;
      auVar49._12_4_ = auVar117._12_4_;
      auVar62 = pshufhw(auVar62,auVar49,0x84);
      auVar79._8_4_ = 0xffffffff;
      auVar79._0_8_ = 0xffffffffffffffff;
      auVar79._12_4_ = 0xffffffff;
      auVar79 = (auVar62 | in_XMM11) ^ auVar79;
      auVar62 = packssdw(auVar79,auVar79);
      auVar62 = packsswb(auVar62,auVar62);
      if ((auVar62._14_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar53 + uVar60 + 0xf) = cVar59 + '\x0f';
      }
      uVar60 = uVar60 + 0x10;
      lVar55 = (long)DAT_0015a1d0;
      lVar86 = auVar100._8_8_;
      auVar100._0_8_ = auVar100._0_8_ + lVar55;
      lVar56 = DAT_0015a1d0._8_8_;
      auVar100._8_8_ = lVar86 + lVar56;
      lVar86 = auVar98._8_8_;
      auVar98._0_8_ = auVar98._0_8_ + lVar55;
      auVar98._8_8_ = lVar86 + lVar56;
      lVar86 = auVar96._8_8_;
      auVar96._0_8_ = auVar96._0_8_ + lVar55;
      auVar96._8_8_ = lVar86 + lVar56;
      lVar86 = auVar94._8_8_;
      auVar94._0_8_ = auVar94._0_8_ + lVar55;
      auVar94._8_8_ = lVar86 + lVar56;
      lVar86 = auVar92._8_8_;
      auVar92._0_8_ = auVar92._0_8_ + lVar55;
      auVar92._8_8_ = lVar86 + lVar56;
      lVar86 = auVar90._8_8_;
      auVar90._0_8_ = auVar90._0_8_ + lVar55;
      auVar90._8_8_ = lVar86 + lVar56;
      lVar86 = auVar87._8_8_;
      auVar87._0_8_ = auVar87._0_8_ + lVar55;
      auVar87._8_8_ = lVar86 + lVar56;
      lVar86 = auVar84._8_8_;
      auVar84._0_8_ = auVar84._0_8_ + lVar55;
      auVar84._8_8_ = lVar86 + lVar56;
      auVar62 = _DAT_0015a1d0;
    } while ((uVar52 + 0xf & 0xfffffffffffffff0) != uVar60);
  }
  memcpy(pvVar54,pvVar53,uVar52);
  if (local_1b0 == 0) {
    dVar82 = 0.0;
  }
  else {
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_178._8_8_;
    local_178 = auVar51 << 0x40;
    uVar52 = 0;
    do {
      lVar55 = ggml_time_us();
      memcpy(pvVar54,pvVar53,local_1b8);
      lVar56 = ggml_time_us();
      local_178._0_8_ = (double)local_178._0_8_ + (double)(lVar56 - lVar55) * 1e-06;
      iVar80 = rand();
      iVar81 = rand();
      *(char *)((long)pvVar53 + (ulong)(long)iVar81 % local_1b8) = (char)iVar80;
      uVar52 = uVar52 + 1;
    } while (uVar52 < local_1b0);
    dVar82 = (double)local_178._0_8_ * 1000000000.0;
  }
  lVar55 = local_1b0 * local_1b8;
  auVar85._8_4_ = (int)((ulong)lVar55 >> 0x20);
  auVar85._0_8_ = lVar55;
  auVar85._12_4_ = 0x45300000;
  snprintf(local_138,0x100,"memcpy: %7.2f GB/s ( 1 thread)\n",
           ((auVar85._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar55) - 4503599627370496.0)) / dVar82);
  std::__cxx11::string::append((char *)&whisper_bench_memcpy_str::s_abi_cxx11_);
  dVar82 = (double)local_1a8._0_8_;
  if (local_1b8 != 0) {
    sVar57 = 0;
    do {
      dVar82 = dVar82 + (double)(int)*(char *)((long)pvVar54 + sVar57);
      sVar57 = sVar57 + 1;
    } while (local_1b8 != sVar57);
  }
  local_1a8._0_8_ = dVar82;
  free(pvVar53);
  free(pvVar54);
  local_1bc = 1;
  if (0 < n_threads) {
    local_15c = n_threads;
    do {
      uVar52 = local_1b8;
      local_190 = malloc(local_1b8);
      local_188 = malloc(uVar52);
      if (uVar52 != 0) {
        uVar60 = 0;
        do {
          *(char *)((long)local_190 + uVar60) = (char)uVar60;
          uVar60 = uVar60 + 1;
          uVar52 = local_1b8;
        } while (uVar60 < local_1b8);
      }
      memcpy(local_188,local_190,uVar52);
      uVar58 = ggml_time_us();
      local_178._0_8_ = uVar58;
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&local_150,(long)(int)local_1bc - 1,(allocator_type *)&local_180);
      if ((int)local_1bc < 2) {
        uVar52 = (ulong)(local_1bc - 1);
      }
      else {
        lVar55 = 0;
        do {
          local_158._M_id._M_thread = (id)0;
          local_180 = (long *)operator_new(0x38);
          *local_180 = (long)&PTR___State_0016d780;
          *(int *)(local_180 + 1) = (int)lVar55;
          local_180[2] = (long)&local_1b8;
          local_180[3] = (long)&local_1bc;
          local_180[4] = (long)&local_1b0;
          local_180[5] = (long)&local_188;
          local_180[6] = (long)&local_190;
          std::thread::_M_start_thread(&local_158,(allocator_type *)&local_180,0);
          if (local_180 != (long *)0x0) {
            (**(code **)(*local_180 + 8))();
          }
          if (local_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[lVar55]._M_id._M_thread != 0) {
            std::terminate();
          }
          local_150.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar55]._M_id._M_thread =
               (native_handle_type)local_158._M_id._M_thread;
          lVar55 = lVar55 + 1;
          uVar52 = (long)(int)local_1bc - 1;
        } while (lVar55 < (long)uVar52);
      }
      uVar60 = (ulong)(int)local_1bc;
      uVar52 = ((long)(int)uVar52 * local_1b8) / uVar60;
      if (local_1b0 != 0) {
        sVar57 = (local_1b8 * uVar60) / uVar60 - uVar52;
        uVar60 = 0;
        do {
          memcpy((void *)((long)local_188 + uVar52),(void *)((long)local_190 + uVar52),sVar57);
          iVar80 = rand();
          pvVar53 = local_190;
          iVar81 = rand();
          *(char *)((long)pvVar53 + (long)iVar81 % (long)sVar57 + uVar52) = (char)iVar80;
          uVar60 = uVar60 + 1;
        } while (uVar60 < local_1b0);
      }
      iVar80 = local_15c;
      if (1 < (int)local_1bc) {
        lVar55 = 0;
        do {
          std::thread::join();
          lVar55 = lVar55 + 1;
        } while (lVar55 < (long)(int)local_1bc + -1);
      }
      lVar55 = ggml_time_us();
      lVar56 = local_1b8 * local_1b0;
      auVar88._8_4_ = (int)((ulong)lVar56 >> 0x20);
      auVar88._0_8_ = lVar56;
      auVar88._12_4_ = 0x45300000;
      snprintf(local_138,0x100,"memcpy: %7.2f GB/s (%2d thread)\n",
               ((auVar88._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar56) - 4503599627370496.0)) /
               (((double)(lVar55 - local_178._0_8_) * 1e-06 + 0.0) * 1000000000.0),(ulong)local_1bc)
      ;
      std::__cxx11::string::append((char *)&whisper_bench_memcpy_str::s_abi_cxx11_);
      dVar82 = (double)local_1a8._0_8_;
      if (local_1b8 != 0) {
        sVar57 = 0;
        do {
          dVar82 = dVar82 + (double)(int)*(char *)((long)local_188 + sVar57);
          sVar57 = sVar57 + 1;
        } while (local_1b8 != sVar57);
      }
      local_1a8._0_8_ = dVar82;
      free(local_190);
      free(local_188);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_150);
      uVar1 = local_1bc + 1;
      bVar2 = (int)local_1bc < iVar80;
      local_1bc = uVar1;
    } while (bVar2);
  }
  snprintf(local_138,0x100,"sum:    %f\n",local_1a8._0_8_);
  std::__cxx11::string::append((char *)&whisper_bench_memcpy_str::s_abi_cxx11_);
  return whisper_bench_memcpy_str::s_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

WHISPER_API const char * whisper_bench_memcpy_str(int n_threads) {
    static std::string s;
    s = "";
    char strbuf[256];

    ggml_time_init();

    size_t n    = 20;
    size_t arr  = n_threads > 0 ? 1024llu : n_threads; // trick to avoid compiler optimizations

    // 1GB array
    const size_t size = arr*1e6;

    double sum  = 0.0;

    // heat-up
    {
        char * src = (char *) malloc(size);
        char * dst = (char *) malloc(size);

        for (size_t i = 0; i < size; i++) src[i] = i;

        memcpy(dst, src, size); // heat-up

        double tsum = 0.0;

        for (size_t i = 0; i < n; i++) {
            const int64_t t0 = ggml_time_us();

            memcpy(dst, src, size);

            const int64_t t1 = ggml_time_us();

            tsum += (t1 - t0)*1e-6;

            src[rand() % size] = rand() % 256;
        }

        snprintf(strbuf, sizeof(strbuf), "memcpy: %7.2f GB/s (heat-up)\n", (double) (n*size)/(tsum*1e9));
        s += strbuf;

        // needed to prevent the compiler from optimizing the memcpy away
        {
            for (size_t i = 0; i < size; i++) sum += dst[i];
        }

        free(src);
        free(dst);
    }

    // single-thread
    {
        char * src = (char *) malloc(size);
        char * dst = (char *) malloc(size);

        for (size_t i = 0; i < size; i++) src[i] = i;

        memcpy(dst, src, size); // heat-up

        double tsum = 0.0;

        for (size_t i = 0; i < n; i++) {
            const int64_t t0 = ggml_time_us();

            memcpy(dst, src, size);

            const int64_t t1 = ggml_time_us();

            tsum += (t1 - t0)*1e-6;

            src[rand() % size] = rand() % 256;
        }

        snprintf(strbuf, sizeof(strbuf), "memcpy: %7.2f GB/s ( 1 thread)\n", (double) (n*size)/(tsum*1e9));
        s += strbuf;

        // needed to prevent the compiler from optimizing the memcpy away
        {
            for (size_t i = 0; i < size; i++) sum += dst[i];
        }

        free(src);
        free(dst);
    }

    // multi-thread

    for (int32_t k = 1; k <= n_threads; k++) {
        char * src = (char *) malloc(size);
        char * dst = (char *) malloc(size);

        for (size_t i = 0; i < size; i++) src[i] = i;

        memcpy(dst, src, size); // heat-up

        double tsum = 0.0;

        auto helper = [&](int th) {
            const int64_t i0 = (th + 0)*size/k;
            const int64_t i1 = (th + 1)*size/k;

            for (size_t i = 0; i < n; i++) {
                memcpy(dst + i0, src + i0, i1 - i0);

                src[i0 + rand() % (i1 - i0)] = rand() % 256;
            };
        };

        const int64_t t0 = ggml_time_us();

        std::vector<std::thread> threads(k - 1);
        for (int32_t th = 0; th < k - 1; ++th) {
            threads[th] = std::thread(helper, th);
        }

        helper(k - 1);

        for (int32_t th = 0; th < k - 1; ++th) {
            threads[th].join();
        }

        const int64_t t1 = ggml_time_us();

        tsum += (t1 - t0)*1e-6;

        snprintf(strbuf, sizeof(strbuf), "memcpy: %7.2f GB/s (%2d thread)\n", (double) (n*size)/(tsum*1e9), k);
        s += strbuf;

        // needed to prevent the compiler from optimizing the memcpy away
        {
            for (size_t i = 0; i < size; i++) sum += dst[i];
        }

        free(src);
        free(dst);
    }

    snprintf(strbuf, sizeof(strbuf), "sum:    %f\n", sum);
    s += strbuf;

    return s.c_str();
}